

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::~FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this)

{
  bool bVar1;
  reference ppIVar2;
  ImmutableFieldGenerator *g;
  iterator __end0;
  iterator __begin0;
  vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
  *__range4;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_local;
  
  __end0 = std::
           vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
           ::begin(&this->field_generators_);
  g = (ImmutableFieldGenerator *)
      std::
      vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
      ::end(&this->field_generators_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_**,_std::vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>_>
                                *)&g);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_**,_std::vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>_>
              ::operator*(&__end0);
    if (*ppIVar2 != (ImmutableFieldGenerator *)0x0) {
      (*((*ppIVar2)->super_FieldGenerator)._vptr_FieldGenerator[1])();
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_**,_std::vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
  ::~vector(&this->field_generators_);
  return;
}

Assistant:

~FieldGeneratorMap() {
    for (const auto* g : field_generators_) {
      delete g;
    }
  }